

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

int __thiscall cs::compiler_type::get_signal_level(compiler_type *this,token_base *ptr)

{
  int iVar1;
  undefined8 uVar2;
  compile_error *this_00;
  int *piVar3;
  token_signal *in_RSI;
  string *in_stack_ffffffffffffff68;
  compile_error *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [32];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  mapping<cs::signal_types,_int> *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [32];
  token_signal *local_10;
  
  if (in_RSI == (token_signal *)0x0) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Get the level of null token.",&local_31);
    compile_error::compile_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar2,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_10 = in_RSI;
  iVar1 = (*(in_RSI->super_token_base)._vptr_token_base[2])();
  if (iVar1 != 3) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Get the level of non-signal token.",&local_69);
    compile_error::compile_error(this_00,in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  token_signal::get_signal(local_10);
  piVar3 = mapping<cs::signal_types,_int>::match
                     (in_stack_ffffffffffffffc0,
                      (signal_types *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  return *piVar3;
}

Assistant:

int get_signal_level(token_base *ptr)
		{
			if (ptr == nullptr)
				throw compile_error("Get the level of null token.");
			if (ptr->get_type() != token_types::signal)
				throw compile_error("Get the level of non-signal token.");
			return signal_level_map.match(static_cast<token_signal *>(ptr)->get_signal());
		}